

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O2

bool __thiscall
BackwardPass::DeadStoreOrChangeInstrForScopeObjRemoval(BackwardPass *this,Instr **pInstrPrev)

{
  OpCode OVar1;
  ArgSlot formalsIndex;
  Func *this_00;
  Sym *sym;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  uint32 index;
  SymOpnd *pSVar5;
  undefined4 *puVar6;
  JITTimeFunctionBody *pJVar7;
  PropertySym *pPVar8;
  StackSym *pSVar9;
  RegOpnd *pRVar10;
  char16 *pcVar11;
  HelperCallOpnd *pHVar12;
  Opnd *pOVar13;
  IntConstOpnd *pIVar14;
  Instr *pIVar15;
  Instr *pIVar16;
  Instr *pIVar17;
  char *this_01;
  Instr *instrToDelete;
  Instr *this_02;
  
  if (this->tag == DeadStorePhase) {
    this_02 = this->currentInstr;
    this_00 = this_02->m_func;
    bVar3 = Func::IsStackArgsEnabled(this_00);
    if (!bVar3) {
      return false;
    }
    if ((this->currentPrePassLoop == (Loop *)0x0) && (this->currentBlock->loop != (Loop *)0x0)) {
      return false;
    }
    OVar1 = this_02->m_opcode;
    if (OVar1 - 0x282 < 2) {
      pOVar13 = this_02->m_src2;
    }
    else {
      if (OVar1 == CallHelper) {
        pHVar12 = IR::Opnd::AsHelperCallOpnd(this_02->m_src1);
        if (pHVar12->m_fnHelper != HelperOP_InitCachedFuncs) {
          return false;
        }
        pSVar9 = IR::Opnd::GetStackSym(this_02->m_src2);
        if ((pSVar9->field_0x18 & 1) == 0) {
          pIVar15 = (Instr *)0x0;
        }
        else {
          pIVar15 = (pSVar9->field_5).m_instrDef;
        }
        pRVar10 = IR::Opnd::AsRegOpnd(pIVar15->m_src1);
        bVar3 = IR::Opnd::IsScopeObjOpnd(&pRVar10->super_Opnd,this_00);
        if (!bVar3) {
          return false;
        }
        pIVar15 = this_02->m_next;
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        while (this_02 != (Instr *)0x0) {
          if (this_02->m_src2 == (Opnd *)0x0) {
            pIVar17 = (Instr *)0x0;
          }
          else {
            pSVar9 = IR::Opnd::GetStackSym(this_02->m_src2);
            pIVar17 = (pSVar9->field_5).m_instrDef;
            pIVar16 = (Instr *)0x0;
            if ((pSVar9->field_0x18 & 1) != 0) {
              pIVar16 = pIVar17;
            }
            if (pIVar16->m_opcode != ArgOut_A) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar6 = 1;
              bVar3 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                 ,0x103e,"(instrDef->m_opcode == Js::OpCode::ArgOut_A)",
                                 "instrDef->m_opcode == Js::OpCode::ArgOut_A");
              if (!bVar3) goto LAB_003cb2ca;
              *puVar6 = 0;
            }
          }
          IR::Instr::Remove(this_02);
          this_02 = pIVar17;
        }
        if (pIVar15 == (Instr *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar6 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x1046,"(nextInstr != nullptr)","nextInstr != nullptr");
          if (!bVar3) {
LAB_003cb2ca:
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar6 = 0;
        }
        *pInstrPrev = pIVar15->m_prev;
        return true;
      }
      if (OVar1 == GetCachedFunc) {
        bVar3 = IR::Opnd::IsScopeObjOpnd(this_02->m_src1,this_00);
        if (!bVar3) {
          return false;
        }
        this_02->m_opcode = NewScFunc;
        pOVar13 = IR::Instr::UnlinkSrc2(this_02);
        bVar3 = IR::Opnd::IsIntConstOpnd(pOVar13);
        if (!bVar3) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar6 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x1057,"(intConstOpnd->IsIntConstOpnd())",
                             "intConstOpnd->IsIntConstOpnd()");
          if (!bVar3) goto LAB_003cb2ca;
          *puVar6 = 0;
        }
        pJVar7 = Func::GetJITFunctionBody(this_02->m_func);
        pIVar14 = IR::Opnd::AsIntConstOpnd(pOVar13);
        index = IR::IntConstOpnd::AsUint32(pIVar14);
        uVar4 = JITTimeFunctionBody::GetNestedFuncIndexForSlotIdInCachedScope(pJVar7,index);
        IR::Opnd::Free(pOVar13,this_02->m_func);
        pIVar14 = IR::IntConstOpnd::New((ulong)uVar4,TyUint32,this_02->m_func,false);
        IR::Instr::ReplaceSrc1(this_02,&pIVar14->super_Opnd);
        pRVar10 = IR::RegOpnd::New(this_00->m_localFrameDisplaySym,TyVar,this_00);
        IR::Instr::SetSrc2(this_02,&pRVar10->super_Opnd);
        return false;
      }
      if (OVar1 != CommitScope) {
        if (OVar1 != LdSlot) {
          return false;
        }
        this_01 = (char *)this_02->m_src1;
        if ((BackwardPass *)this_01 == (BackwardPass *)0x0) {
          return false;
        }
        bVar3 = IR::Opnd::IsSymOpnd((Opnd *)this_01);
        if (!bVar3) {
          return false;
        }
        pSVar5 = IR::Opnd::AsSymOpnd((Opnd *)this_01);
        sym = pSVar5->m_sym;
        if (sym == (Sym *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar6 = 1;
          this_01 = 
          "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
          ;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x1001,"(sym)","sym");
          if (!bVar3) goto LAB_003cb2ca;
          *puVar6 = 0;
        }
        bVar3 = IsFormalParamSym((BackwardPass *)this_01,this_00,sym);
        if (!bVar3) {
          return false;
        }
        pJVar7 = Func::GetJITFunctionBody(this_00);
        bVar3 = JITTimeFunctionBody::HasImplicitArgIns(pJVar7);
        if (bVar3) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar6 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x1004,"(!currFunc->GetJITFunctionBody()->HasImplicitArgIns())",
                             "We don\'t have mappings between named formals and arguments object here"
                            );
          if (!bVar3) goto LAB_003cb2ca;
          *puVar6 = 0;
        }
        this_02->m_opcode = Ld_A;
        pPVar8 = Sym::AsPropertySym(sym);
        formalsIndex = (ArgSlot)pPVar8->m_propertyId;
        bVar3 = Func::HasStackSymForFormal(this_00,formalsIndex);
        if (!bVar3) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar6 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x100a,"(currFunc->HasStackSymForFormal(value))",
                             "currFunc->HasStackSymForFormal(value)");
          if (!bVar3) goto LAB_003cb2ca;
          *puVar6 = 0;
        }
        pSVar9 = Func::GetStackSymForFormal(this_00,formalsIndex);
        pRVar10 = IR::RegOpnd::New(pSVar9,TyVar,this_00);
        IR::Opnd::SetIsJITOptimizedReg(&pRVar10->super_Opnd,true);
        IR::Instr::ReplaceSrc1(this_02,&pRVar10->super_Opnd);
        ProcessSymUse(this,&pSVar9->super_Sym,false,'\x01');
        bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,StackArgFormalsOptPhase);
        if (!bVar3) {
          return false;
        }
        if (DAT_0145948a != '\x01') {
          return false;
        }
        pJVar7 = Func::GetJITFunctionBody(this_02->m_func);
        pcVar11 = JITTimeFunctionBody::GetDisplayName(pJVar7);
        uVar4 = Func::GetFunctionNumber(this_02->m_func);
        Output::Print(L"StackArgFormals : %s (%d) :Replacing LdSlot with Ld_A in Deadstore pass. \n"
                      ,pcVar11,(ulong)uVar4);
        Output::Flush();
        return false;
      }
      pOVar13 = this_02->m_src1;
    }
    bVar3 = IR::Opnd::IsScopeObjOpnd(pOVar13,this_00);
    if (bVar3) {
      IR::Instr::Remove(this_02);
      return true;
    }
  }
  return false;
}

Assistant:

bool
BackwardPass::DeadStoreOrChangeInstrForScopeObjRemoval(IR::Instr ** pInstrPrev)
{
    IR::Instr * instr = this->currentInstr;
    Func * currFunc = instr->m_func;

    if (this->tag == Js::DeadStorePhase && instr->m_func->IsStackArgsEnabled() && (IsPrePass() || !currentBlock->loop))
    {
        switch (instr->m_opcode)
        {
            /*
            *   This LdSlot loads the formal from the formals array. We replace this a Ld_A <ArgInSym>.
            *   ArgInSym is inserted at the beginning of the function during the start of the deadstore pass- for the top func.
            *   In case of inlinee, it will be from the source sym of the ArgOut Instruction to the inlinee.
            */
            case Js::OpCode::LdSlot:
            {
                IR::Opnd * src1 = instr->GetSrc1();
                if (src1 && src1->IsSymOpnd())
                {
                    Sym * sym = src1->AsSymOpnd()->m_sym;
                    Assert(sym);
                    if (IsFormalParamSym(currFunc, sym))
                    {
                        AssertMsg(!currFunc->GetJITFunctionBody()->HasImplicitArgIns(), "We don't have mappings between named formals and arguments object here");

                        instr->m_opcode = Js::OpCode::Ld_A;
                        PropertySym * propSym = sym->AsPropertySym();
                        Js::ArgSlot    value = (Js::ArgSlot)propSym->m_propertyId;

                        Assert(currFunc->HasStackSymForFormal(value));
                        StackSym * paramStackSym = currFunc->GetStackSymForFormal(value);
                        IR::RegOpnd * srcOpnd = IR::RegOpnd::New(paramStackSym, TyVar, currFunc);
                        srcOpnd->SetIsJITOptimizedReg(true);
                        instr->ReplaceSrc1(srcOpnd);
                        this->ProcessSymUse(paramStackSym, true, true);

                        if (PHASE_VERBOSE_TRACE1(Js::StackArgFormalsOptPhase))
                        {
                            Output::Print(_u("StackArgFormals : %s (%d) :Replacing LdSlot with Ld_A in Deadstore pass. \n"), instr->m_func->GetJITFunctionBody()->GetDisplayName(), instr->m_func->GetFunctionNumber());
                            Output::Flush();
                        }
                    }
                }
                break;
            }
            case Js::OpCode::CommitScope:
            {
                if (instr->GetSrc1()->IsScopeObjOpnd(currFunc))
                {
                    instr->Remove();
                    return true;
                }
                break;
            }
            case Js::OpCode::BrFncCachedScopeEq:
            case Js::OpCode::BrFncCachedScopeNeq:
            {
                if (instr->GetSrc2()->IsScopeObjOpnd(currFunc))
                {
                    instr->Remove();
                    return true;
                }
                break;
            }
            case Js::OpCode::CallHelper:
            {
                //Remove the CALL and all its Argout instrs.
                if (instr->GetSrc1()->AsHelperCallOpnd()->m_fnHelper == IR::JnHelperMethod::HelperOP_InitCachedFuncs)
                {
                    IR::RegOpnd * scopeObjOpnd = instr->GetSrc2()->GetStackSym()->GetInstrDef()->GetSrc1()->AsRegOpnd();
                    if (scopeObjOpnd->IsScopeObjOpnd(currFunc))
                    {
                        IR::Instr * instrDef = instr;
                        IR::Instr * nextInstr = instr->m_next;

                        while (instrDef != nullptr)
                        {
                            IR::Instr * instrToDelete = instrDef;
                            if (instrDef->GetSrc2() != nullptr)
                            {
                                instrDef = instrDef->GetSrc2()->GetStackSym()->GetInstrDef();
                                Assert(instrDef->m_opcode == Js::OpCode::ArgOut_A);
                            }
                            else
                            {
                                instrDef = nullptr;
                            }
                            instrToDelete->Remove();
                        }
                        Assert(nextInstr != nullptr);
                        *pInstrPrev = nextInstr->m_prev;
                        return true;
                    }
                }
                break;
            }
            case Js::OpCode::GetCachedFunc:
            {
                // <dst> = GetCachedFunc <scopeObject>, <functionNum>
                // is converted to
                // <dst> = NewScFunc <functionNum>, <env: FrameDisplay>

                if (instr->GetSrc1()->IsScopeObjOpnd(currFunc))
                {
                    instr->m_opcode = Js::OpCode::NewScFunc;
                    IR::Opnd * intConstOpnd = instr->UnlinkSrc2();
                    Assert(intConstOpnd->IsIntConstOpnd());

                    uint nestedFuncIndex = instr->m_func->GetJITFunctionBody()->GetNestedFuncIndexForSlotIdInCachedScope(intConstOpnd->AsIntConstOpnd()->AsUint32());
                    intConstOpnd->Free(instr->m_func);

                    instr->ReplaceSrc1(IR::IntConstOpnd::New(nestedFuncIndex, TyUint32, instr->m_func));
                    instr->SetSrc2(IR::RegOpnd::New(currFunc->GetLocalFrameDisplaySym(), IRType::TyVar, currFunc));
                }
                break;
            }
        }
    }
    return false;
}